

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

int Fra_SmlCheckNonConstOutputs(Fra_Sml_t *p)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  int i;
  
  i = 0;
  do {
    pAVar1 = p->pAig;
    if (pAVar1->nObjs[3] - pAVar1->nRegs <= i) {
      return 0;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar1->vCos,i);
    iVar2 = Fra_SmlNodeIsZero(p,pObj);
    i = i + 1;
  } while (iVar2 != 0);
  return 1;
}

Assistant:

int Fra_SmlCheckNonConstOutputs( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachPoSeq( p->pAig, pObj, i )
        if ( !Fra_SmlNodeIsZero(p, pObj) )
            return 1;
    return 0;
}